

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O3

void Aig_RManStop(Aig_RMan_t *p)

{
  ulong uVar1;
  long lVar2;
  
  printf("Total funcs    = %10d\n",(ulong)(uint)p->nTotal);
  printf("Full DSD funcs = %10d\n",(ulong)(uint)p->nTtDsd);
  printf("Part DSD funcs = %10d\n",(ulong)(uint)p->nTtDsdPart);
  printf("Non- DSD funcs = %10d\n",(ulong)(uint)p->nTtDsdNot);
  printf("Uniq-var funcs = %10d\n",(ulong)(uint)p->nUniqueVars);
  printf("Unique   funcs = %10d\n");
  puts("Distribution of functions:");
  if (4 < p->nVars) {
    lVar2 = 0x351;
    do {
      uVar1 = lVar2 - 0x34c;
      printf("%2d = %8d\n",uVar1 & 0xffffffff,(ulong)p->pTruthInit[lVar2 + -0xe]);
      lVar2 = lVar2 + 1;
    } while ((long)uVar1 < (long)p->nVars);
  }
  Aig_MmFlexStop(p->pMemTrus,0);
  Aig_ManStop(p->pAig);
  Bdc_ManFree(p->pBidec);
  if (p->pBins != (Aig_Tru_t **)0x0) {
    free(p->pBins);
  }
  free(p);
  return;
}

Assistant:

void Aig_RManStop( Aig_RMan_t * p )
{
    int i;
    printf( "Total funcs    = %10d\n", p->nTotal );
    printf( "Full DSD funcs = %10d\n", p->nTtDsd );
    printf( "Part DSD funcs = %10d\n", p->nTtDsdPart );
    printf( "Non- DSD funcs = %10d\n", p->nTtDsdNot );
    printf( "Uniq-var funcs = %10d\n", p->nUniqueVars );
    printf( "Unique   funcs = %10d\n", p->nEntries );
    printf( "Distribution of functions:\n" );
    for ( i = 5; i <= p->nVars; i++ )
        printf( "%2d = %8d\n", i, p->nVarFuncs[i] );
    Aig_MmFlexStop( p->pMemTrus, 0 );
    Aig_ManStop( p->pAig );
    Bdc_ManFree( p->pBidec );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}